

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DArrayCase::generateIterations
          (TextureGather2DArrayCase *this)

{
  GatherType gatherType;
  int iVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  Iteration local_a8;
  int local_78;
  int basicNdx_1;
  Iteration local_68;
  int local_38;
  int local_34;
  int basicNdx;
  int layerNdx;
  undefined1 local_28 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  basicIterations;
  TextureGather2DArrayCase *this_local;
  
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  basicIterations.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)&basicNdx);
  generateBasic2DCaseIterations
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
              *)local_28,gatherType,&(this->super_TextureGatherCase).m_textureFormat,
             (IVec2 *)&basicNdx);
  local_34 = -1;
  do {
    iVar1 = local_34;
    iVar3 = tcu::Vector<int,_3>::z(&this->m_textureSize);
    if (iVar3 + 1 <= iVar1) {
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                 *)local_28);
      return;
    }
    if (local_34 == 0) {
      for (local_38 = 0; iVar1 = local_38,
          sVar4 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                  ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                          *)local_28), iVar1 < (int)sVar4; local_38 = local_38 + 1) {
        local_68.gatherArgs.offsets[1].m_data[1] = 0;
        local_68.gatherArgs.offsets[2].m_data[0] = 0;
        local_68.gatherArgs.offsets[2].m_data[1] = 0;
        local_68.gatherArgs.offsets[3].m_data[0] = 0;
        local_68.gatherArgs.componentNdx = 0;
        local_68.gatherArgs.offsets[0].m_data[0] = 0;
        local_68.gatherArgs.offsets[0].m_data[1] = 0;
        local_68.gatherArgs.offsets[1].m_data[0] = 0;
        local_68.gatherArgs.offsets[3].m_data[1] = 0;
        local_68.layerNdx = 0;
        Iteration::Iteration(&local_68);
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
        ::push_back(&this->m_iterations,&local_68);
        pvVar5 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                 ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                               *)local_28,(long)local_38);
        pvVar6 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
                 ::back(&this->m_iterations);
        memcpy(pvVar6,pvVar5,0x24);
        iVar1 = local_34;
        pvVar6 = std::
                 vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
                 ::back(&this->m_iterations);
        pvVar6->layerNdx = iVar1;
      }
    }
    else {
      for (local_78 = 0; iVar1 = local_78,
          sVar4 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                  ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                          *)local_28), iVar1 < (int)sVar4; local_78 = local_78 + 1) {
        bVar2 = isDepthFormat(&(this->super_TextureGatherCase).m_textureFormat);
        if ((bVar2) ||
           (pvVar5 = std::
                     vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                     ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                                   *)local_28,(long)local_78),
           pvVar5->componentNdx == (local_34 + 2) % 4)) {
          local_a8.gatherArgs.offsets[1].m_data[1] = 0;
          local_a8.gatherArgs.offsets[2].m_data[0] = 0;
          local_a8.gatherArgs.offsets[2].m_data[1] = 0;
          local_a8.gatherArgs.offsets[3].m_data[0] = 0;
          local_a8.gatherArgs.componentNdx = 0;
          local_a8.gatherArgs.offsets[0].m_data[0] = 0;
          local_a8.gatherArgs.offsets[0].m_data[1] = 0;
          local_a8.gatherArgs.offsets[1].m_data[0] = 0;
          local_a8.gatherArgs.offsets[3].m_data[1] = 0;
          local_a8.layerNdx = 0;
          Iteration::Iteration(&local_a8);
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
          ::push_back(&this->m_iterations,&local_a8);
          pvVar5 = std::
                   vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                   ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                                 *)local_28,(long)local_78);
          pvVar6 = std::
                   vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
                   ::back(&this->m_iterations);
          memcpy(pvVar6,pvVar5,0x24);
          iVar1 = local_34;
          pvVar6 = std::
                   vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGather2DArrayCase::Iteration>_>
                   ::back(&this->m_iterations);
          pvVar6->layerNdx = iVar1;
          break;
        }
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void TextureGather2DArrayCase::generateIterations (void)
{
	DE_ASSERT(m_iterations.empty());

	const vector<GatherArgs> basicIterations = generateBasic2DCaseIterations(m_gatherType, m_textureFormat, getOffsetRange());

	// \note Out-of-bounds layer indices are tested too.
	for (int layerNdx = -1; layerNdx < m_textureSize.z()+1; layerNdx++)
	{
		// Don't duplicate all cases for all layers.
		if (layerNdx == 0)
		{
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				m_iterations.push_back(Iteration());
				m_iterations.back().gatherArgs = basicIterations[basicNdx];
				m_iterations.back().layerNdx = layerNdx;
			}
		}
		else
		{
			// For other layers than 0, only test one component and one set of offsets per layer.
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				if (isDepthFormat(m_textureFormat) || basicIterations[basicNdx].componentNdx == (layerNdx + 2) % 4)
				{
					m_iterations.push_back(Iteration());
					m_iterations.back().gatherArgs = basicIterations[basicNdx];
					m_iterations.back().layerNdx = layerNdx;
					break;
				}
			}
		}
	}
}